

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *this,EvalContext *ctx)

{
  ApplyFunc *pAVar1;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *pEVar2;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 local_148 [288];
  
  pAVar1 = this->m_func;
  (*(((this->m_args).a.super_ContainerExprPBase<tcu::Matrix<float,_3,_4>_>.
      super_ExprPBase<tcu::Matrix<float,_3,_4>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_4>_>_>.
     m_ptr)->super_ExprBase)._vptr_ExprBase[4])(local_148);
  pEVar2 = (this->m_args).b.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(pEVar2,ctx);
  pEVar2 = (this->m_args).c.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(pEVar2,ctx);
  pEVar2 = (this->m_args).d.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(pEVar2,ctx);
  local_160 = &local_169;
  local_158 = &local_16a;
  local_150 = &local_16b;
  local_168 = local_148;
  (**(code **)(*(long *)pAVar1 + 0x40))(__return_storage_ptr__,pAVar1,ctx);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}